

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::copyTexImage2D
          (ReferenceContext *this,deUint32 target,int level,deUint32 internalFormat,int x,int y,
          int width,int height,int border)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  int iVar4;
  CubeFace face_00;
  reference pvVar5;
  TextureFormat *pTVar6;
  PixelBufferAccess *pPVar7;
  ConstPixelBufferAccess *pCVar8;
  TextureCube *local_1b0;
  Texture2D *local_190;
  Vec4 local_178;
  int local_168;
  int local_164;
  int xo_1;
  int yo_1;
  PixelBufferAccess dst_2;
  ConstPixelBufferAccess dst_3;
  CubeFace face;
  TextureCube *texture_1;
  int local_f0;
  int local_ec;
  int xo;
  int yo;
  PixelBufferAccess dst;
  ConstPixelBufferAccess dst_1;
  Texture2D *texture;
  MultisamplePixelBufferAccess local_88;
  undefined1 local_60 [8];
  MultisampleConstPixelBufferAccess src;
  TextureFormat storageFmt;
  TextureUnit *unit;
  int y_local;
  int x_local;
  deUint32 internalFormat_local;
  int level_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  pvVar5 = std::
           vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ::operator[](&this->m_textureUnits,(long)this->m_activeTexture);
  tcu::TextureFormat::TextureFormat((TextureFormat *)&src.m_access.m_data);
  getReadColorbuffer(&local_88,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)local_60,&local_88);
  do {
    if (border != 0) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    if (((width < 0) || (height < 0)) || (level < 0)) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    bVar1 = isEmpty((MultisampleConstPixelBufferAccess *)local_60);
    if (bVar1) {
      setError(this,0x502);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  src.m_access.m_data = (void *)mapInternalFormat(internalFormat);
  do {
    if (((int)src.m_access.m_data == 0x15) || (src.m_access.m_data._4_4_ == 0x26)) {
      setError(this,0x500);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if (target == 0xde1) {
    do {
      if (((this->m_limits).maxTexture2DSize < width) ||
         ((this->m_limits).maxTexture2DSize < height)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      iVar3 = ::deLog2Floor32((this->m_limits).maxTexture2DSize);
      if (iVar3 < level) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    if (pvVar5->tex2DBinding == (Texture2D *)0x0) {
      local_190 = &pvVar5->default2DTex;
    }
    else {
      local_190 = pvVar5->tex2DBinding;
    }
    bVar1 = rc::Texture::isImmutable(&local_190->super_Texture);
    if (bVar1) {
      do {
        bVar1 = rc::Texture2D::hasLevel(local_190,level);
        if (!bVar1) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pCVar8 = &rc::Texture2D::getLevel(local_190,level)->super_ConstPixelBufferAccess;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&dst.super_ConstPixelBufferAccess.m_data,pCVar8);
      do {
        pTVar6 = tcu::ConstPixelBufferAccess::getFormat
                           ((ConstPixelBufferAccess *)&dst.super_ConstPixelBufferAccess.m_data);
        bVar1 = tcu::TextureFormat::operator!=((TextureFormat *)&src.m_access.m_data,pTVar6);
        if (((bVar1) ||
            (iVar3 = tcu::ConstPixelBufferAccess::getWidth
                               ((ConstPixelBufferAccess *)&dst.super_ConstPixelBufferAccess.m_data),
            width != iVar3)) ||
           (iVar3 = tcu::ConstPixelBufferAccess::getHeight
                              ((ConstPixelBufferAccess *)&dst.super_ConstPixelBufferAccess.m_data),
           height != iVar3)) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
    }
    else {
      rc::Texture2D::allocLevel(local_190,level,(TextureFormat *)&src.m_access.m_data,width,height);
    }
    pPVar7 = rc::Texture2D::getLevel(local_190,level);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&xo,pPVar7);
    for (local_ec = 0; local_ec < height; local_ec = local_ec + 1) {
      for (local_f0 = 0; local_f0 < width; local_f0 = local_f0 + 1) {
        iVar3 = x + local_f0;
        pCVar8 = rr::MultisampleConstPixelBufferAccess::raw
                           ((MultisampleConstPixelBufferAccess *)local_60);
        iVar4 = tcu::ConstPixelBufferAccess::getHeight(pCVar8);
        bVar1 = de::inBounds<int>(iVar3,0,iVar4);
        if (bVar1) {
          iVar3 = y + local_ec;
          pCVar8 = rr::MultisampleConstPixelBufferAccess::raw
                             ((MultisampleConstPixelBufferAccess *)local_60);
          iVar4 = tcu::ConstPixelBufferAccess::getDepth(pCVar8);
          bVar1 = de::inBounds<int>(iVar3,0,iVar4);
          if (bVar1) {
            rr::resolveMultisamplePixel
                      ((rr *)&texture_1,(MultisampleConstPixelBufferAccess *)local_60,x + local_f0,
                       y + local_ec);
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&xo,(Vec4 *)&texture_1,local_f0,local_ec,0);
          }
        }
      }
    }
  }
  else if (((target == 0x8516) || (target == 0x8515)) ||
          ((target == 0x8518 || (((target == 0x8517 || (target == 0x851a)) || (target == 0x8519)))))
          ) {
    do {
      if ((width != height) || ((this->m_limits).maxTextureCubeSize < width)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      iVar3 = ::deLog2Floor32((this->m_limits).maxTextureCubeSize);
      if (iVar3 < level) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    if (pvVar5->texCubeBinding == (TextureCube *)0x0) {
      local_1b0 = &pvVar5->defaultCubeTex;
    }
    else {
      local_1b0 = pvVar5->texCubeBinding;
    }
    face_00 = mapGLCubeFace(target);
    bVar1 = rc::Texture::isImmutable(&local_1b0->super_Texture);
    if (bVar1) {
      do {
        bVar1 = rc::TextureCube::hasFace(local_1b0,level,face_00);
        if (!bVar1) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pCVar8 = &rc::TextureCube::getFace(local_1b0,level,face_00)->super_ConstPixelBufferAccess;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&dst_2.super_ConstPixelBufferAccess.m_data,pCVar8);
      do {
        pTVar6 = tcu::ConstPixelBufferAccess::getFormat
                           ((ConstPixelBufferAccess *)&dst_2.super_ConstPixelBufferAccess.m_data);
        bVar1 = tcu::TextureFormat::operator!=((TextureFormat *)&src.m_access.m_data,pTVar6);
        if (((bVar1) ||
            (iVar3 = tcu::ConstPixelBufferAccess::getWidth
                               ((ConstPixelBufferAccess *)&dst_2.super_ConstPixelBufferAccess.m_data
                               ), width != iVar3)) ||
           (iVar3 = tcu::ConstPixelBufferAccess::getHeight
                              ((ConstPixelBufferAccess *)&dst_2.super_ConstPixelBufferAccess.m_data)
           , height != iVar3)) {
          setError(this,0x502);
          return;
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
    }
    else {
      rc::TextureCube::allocFace
                (local_1b0,level,face_00,(TextureFormat *)&src.m_access.m_data,width,height);
    }
    pPVar7 = rc::TextureCube::getFace(local_1b0,level,face_00);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&xo_1,pPVar7);
    for (local_164 = 0; local_164 < height; local_164 = local_164 + 1) {
      for (local_168 = 0; local_168 < width; local_168 = local_168 + 1) {
        iVar3 = x + local_168;
        pCVar8 = rr::MultisampleConstPixelBufferAccess::raw
                           ((MultisampleConstPixelBufferAccess *)local_60);
        iVar4 = tcu::ConstPixelBufferAccess::getHeight(pCVar8);
        bVar1 = de::inBounds<int>(iVar3,0,iVar4);
        if (bVar1) {
          iVar3 = y + local_164;
          pCVar8 = rr::MultisampleConstPixelBufferAccess::raw
                             ((MultisampleConstPixelBufferAccess *)local_60);
          iVar4 = tcu::ConstPixelBufferAccess::getDepth(pCVar8);
          bVar1 = de::inBounds<int>(iVar3,0,iVar4);
          if (bVar1) {
            rr::resolveMultisamplePixel
                      ((rr *)&local_178,(MultisampleConstPixelBufferAccess *)local_60,x + local_168,
                       y + local_164);
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&xo_1,&local_178,local_168,local_164,0);
          }
        }
      }
    }
  }
  else {
    setError(this,0x500);
  }
  return;
}

Assistant:

void ReferenceContext::copyTexImage2D (deUint32 target, int level, deUint32 internalFormat, int x, int y, int width, int height, int border)
{
	TextureUnit&							unit		= m_textureUnits[m_activeTexture];
	TextureFormat							storageFmt;
	rr::MultisampleConstPixelBufferAccess	src			= getReadColorbuffer();

	RC_IF_ERROR(border != 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0 || level < 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(isEmpty(src), GL_INVALID_OPERATION, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_2D)
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize || height > m_limits.maxTexture2DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture2D* texture = unit.tex2DBinding ? unit.tex2DBinding : &unit.default2DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height);

		// Copy from current framebuffer.
		PixelBufferAccess dst = texture->getLevel(level);
		for (int yo = 0; yo < height; yo++)
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()) || !de::inBounds(y+yo, 0, src.raw().getDepth()))
				continue; // Undefined pixel.

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y+yo), xo, yo);
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z)
	{
		// Validate size and level.
		RC_IF_ERROR(width != height || width > m_limits.maxTextureCubeSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTextureCubeSize), GL_INVALID_VALUE, RC_RET_VOID);

		TextureCube*	texture	= unit.texCubeBinding ? unit.texCubeBinding : &unit.defaultCubeTex;
		tcu::CubeFace	face	= mapGLCubeFace(target);

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasFace(level, face), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getFace(level, face));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocFace(level, face, storageFmt, width, height);

		// Copy from current framebuffer.
		PixelBufferAccess dst = texture->getFace(level, face);
		for (int yo = 0; yo < height; yo++)
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()) || !de::inBounds(y+yo, 0, src.raw().getDepth()))
				continue; // Undefined pixel.

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y+yo), xo, yo);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}